

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O1

void __thiscall CSocekt::clearMsgSendQueue(CSocekt *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *point;
  CMemory *this_00;
  
  this_00 = CMemory::GetInstance();
  p_Var2 = (this->m_MsgSendQueue).super__List_base<char_*,_std::allocator<char_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->m_MsgSendQueue) {
    point = p_Var2[1]._M_next;
    psVar1 = &(this->m_MsgSendQueue).super__List_base<char_*,_std::allocator<char_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2);
    CMemory::FreeMemory(this_00,point);
    p_Var2 = (this->m_MsgSendQueue).super__List_base<char_*,_std::allocator<char_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
  }
  return;
}

Assistant:

void CSocekt::clearMsgSendQueue()
{
	char * sTmpMempoint;
	CMemory *p_memory = CMemory::GetInstance();
	
	while(!m_MsgSendQueue.empty())
	{
		sTmpMempoint = m_MsgSendQueue.front();
		m_MsgSendQueue.pop_front(); 
		p_memory->FreeMemory(sTmpMempoint);
	}	
}